

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint32_t decoded;
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  uint64_t *puVar10;
  long lVar11;
  uint32_t *puVar12;
  ulong uVar13;
  rfc7181_metric_field metric;
  ushort local_34;
  ushort local_32;
  
  BEGIN_TESTING((_func_void *)0x0);
  cunit_start_test("test_timetlv_decoding");
  puVar10 = _timetlv_table;
  uVar13 = 0;
  do {
    uVar7 = rfc5497_timetlv_decode(uVar13 & 0xff);
    cunit_named_check(uVar7 == *puVar10,"test_timetlv_decoding",0x267,
                      "decode(%lu) != %lu (was %lu instead)",uVar13,*puVar10,uVar7);
    uVar13 = uVar13 + 1;
    puVar10 = puVar10 + 1;
  } while (uVar13 != 0x100);
  cunit_end_test("test_timetlv_decoding");
  cunit_start_test("test_timetlv_encoding_exact");
  uVar13 = 1;
  uVar7 = 0;
  do {
    uVar2 = _timetlv_table[uVar13];
    if (uVar2 != uVar7) {
      bVar4 = rfc5497_timetlv_encode(uVar2);
      cunit_named_check(uVar13 == bVar4,"test_timetlv_encoding_exact",0x27b,"encode(%lu) != %lu",
                        uVar2,uVar13);
    }
    uVar13 = uVar13 + 1;
    uVar7 = uVar2;
  } while (uVar13 != 0x100);
  cunit_end_test("test_timetlv_encoding_exact");
  cunit_start_test("test_timetlv_encoding_average");
  lVar8 = 1;
  uVar13 = 0;
  do {
    uVar3 = _timetlv_table[lVar8];
    if (1 < uVar3 - uVar13) {
      lVar11 = -1;
      do {
        uVar9 = (ulong)(uint)((int)uVar3 + (int)lVar11);
        if (uVar13 < uVar9) {
          _do_timetlv_average_test(uVar9);
        }
        lVar11 = lVar11 + -1;
      } while (lVar11 != -5);
      lVar11 = 0;
      do {
        uVar9 = (ulong)(uint)((int)uVar13 + 1 + (int)lVar11);
        if (uVar9 < uVar3) {
          _do_timetlv_average_test(uVar9);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
    }
    lVar8 = lVar8 + 1;
    uVar13 = uVar3;
  } while (lVar8 != 0x100);
  cunit_end_test("test_timetlv_encoding_average");
  cunit_start_test("test_metric_decoding");
  puVar12 = _metric_table;
  uVar13 = 0;
  do {
    local_34 = (ushort)uVar13 << 8 | (ushort)uVar13 >> 8;
    uVar5 = rfc7181_metric_decode(&local_34);
    cunit_named_check(uVar5 == *puVar12,"test_metric_decoding",0x2c0,"decode(%u) != %u",
                      uVar13 & 0xffffffff,(ulong)uVar5);
    uVar13 = uVar13 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar13 != 0x1000);
  cunit_end_test("test_metric_decoding");
  cunit_start_test("test_metric_encoding_exact");
  puVar12 = _metric_table;
  uVar13 = 0;
  do {
    uVar5 = *puVar12;
    iVar6 = rfc7181_metric_encode(&local_32,uVar5);
    cunit_named_check(iVar6 == 0,"test_metric_encoding_exact",0x2cf,"Metric encoding failed : %u",
                      (ulong)uVar5);
    cunit_named_check(uVar13 == (ushort)(local_32 << 8 | local_32 >> 8),"test_metric_encoding_exact"
                      ,0x2d1,"encode(%u) != %u",(ulong)uVar5,uVar13 & 0xffffffff);
    uVar13 = uVar13 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar13 != 0x1000);
  cunit_end_test("test_metric_encoding_exact");
  cunit_start_test("test_metric_encoding_average");
  lVar8 = 1;
  uVar5 = 1;
  do {
    uVar1 = _metric_table[lVar8];
    if (1 < uVar1 - uVar5) {
      iVar6 = -1;
      do {
        if (uVar5 < uVar1 + iVar6) {
          _do_metric_average_test(uVar1 + iVar6);
        }
        iVar6 = iVar6 + -1;
      } while (iVar6 != -5);
      iVar6 = 0;
      do {
        decoded = uVar5 + 1 + iVar6;
        if (decoded < uVar1) {
          _do_metric_average_test(decoded);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != 4);
    }
    lVar8 = lVar8 + 1;
    uVar5 = uVar1;
  } while (lVar8 != 0x1000);
  cunit_end_test("test_metric_encoding_average");
  iVar6 = FINISH_TESTING();
  return iVar6;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(NULL);

  test_timetlv_decoding();
  test_timetlv_encoding_exact();
  test_timetlv_encoding_average();

  test_metric_decoding();
  test_metric_encoding_exact();
  test_metric_encoding_average();

  return FINISH_TESTING();
}